

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_is_subset(array_container_t *container1,array_container_t *container2)

{
  bool bVar1;
  int local_28;
  int local_24;
  int i2;
  int i1;
  array_container_t *container2_local;
  array_container_t *container1_local;
  
  if (container2->cardinality < container1->cardinality) {
    return false;
  }
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < container1->cardinality) {
      bVar1 = local_28 < container2->cardinality;
    }
    if (!bVar1) break;
    if (container1->array[local_24] == container2->array[local_28]) {
      local_24 = local_24 + 1;
    }
    else if (container1->array[local_24] <= container2->array[local_28]) {
      return false;
    }
    local_28 = local_28 + 1;
  }
  if (local_24 == container1->cardinality) {
    return true;
  }
  return false;
}

Assistant:

bool array_container_is_subset(const array_container_t *container1,
                               const array_container_t *container2) {
    if (container1->cardinality > container2->cardinality) {
        return false;
    }
    int i1 = 0, i2 = 0;
    while (i1 < container1->cardinality && i2 < container2->cardinality) {
        if (container1->array[i1] == container2->array[i2]) {
            i1++;
            i2++;
        } else if (container1->array[i1] > container2->array[i2]) {
            i2++;
        } else {  // container1->array[i1] < container2->array[i2]
            return false;
        }
    }
    if (i1 == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}